

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

void Vec_WrdDumpHex(char *pFileName,Vec_Wrd_t *p,int nWords,int fVerbose)

{
  word *pwVar1;
  ulong uVar2;
  FILE *__stream;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  
  uVar2 = (long)p->nSize / (long)nWords;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if (p->nSize % nWords == 0) {
    if (0 < (int)uVar2) {
      uVar7 = 1;
      if (1 < nWords * 0x10) {
        uVar7 = nWords * 0x10;
      }
      uVar5 = 0;
      do {
        lVar4 = uVar5 * (long)nWords;
        if ((lVar4 < 0) || (p->nSize <= lVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < nWords) {
          pwVar1 = p->pArray;
          bVar8 = 0;
          uVar6 = 0;
          do {
            uVar3 = (uint)(pwVar1[lVar4 + (uVar6 >> 4)] >> (bVar8 & 0x3c)) & 0xf;
            if (uVar3 < 10) {
              fprintf(__stream,"%d");
            }
            else {
              fputc(uVar3 + 0x37,__stream);
            }
            uVar3 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar3;
            bVar8 = bVar8 + 4;
          } while (uVar7 != uVar3);
        }
        fputc(10,__stream);
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uVar2 & 0xffffffff));
    }
    fclose(__stream);
    printf("Written %d words of simulation data for %d objects into file \"%s\".\n",
           (ulong)(uint)nWords,(long)p->nSize / (long)nWords & 0xffffffff,pFileName);
    return;
  }
  __assert_fail("Vec_WrdSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x4f6,"void Vec_WrdDumpHex(char *, Vec_Wrd_t *, int, int)");
}

Assistant:

static inline void Vec_WrdDumpHex( char * pFileName, Vec_Wrd_t * p, int nWords, int fVerbose )
{
    int i, nNodes = Vec_WrdSize(p) / nWords;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    for ( i = 0; i < nNodes; i++ )
        Gia_ManSimPatWriteOne( pFile, Vec_WrdEntryP(p, i*nWords), nWords );
    fclose( pFile );
    if ( fVerbose )
        printf( "Written %d words of simulation data for %d objects into file \"%s\".\n", nWords, Vec_WrdSize(p)/nWords, pFileName );
}